

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::deleteProgramObject(ReferenceContext *this,ShaderProgramObjectContainer *sp)

{
  bool bVar1;
  
  if (this->m_currentProgram == sp) {
    bVar1 = sp->m_deleteFlag;
    (*(this->super_Context)._vptr_Context[0x76])(this,0);
    if (bVar1 != false) {
      return;
    }
  }
  rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::releaseReference(&this->m_programs,sp);
  return;
}

Assistant:

void ReferenceContext::deleteProgramObject (rc::ShaderProgramObjectContainer* sp)
{
	// Unbinding program will delete it
	if (m_currentProgram == sp && sp->m_deleteFlag)
	{
		useProgram(0);
		return;
	}

	// Unbinding program will NOT delete it
	if (m_currentProgram == sp)
		useProgram(0);

	DE_ASSERT(sp->getRefCount() == 1);
	m_programs.releaseReference(sp);
}